

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

bool DnsStats::GetTLD(uint8_t *packet,uint32_t length,uint32_t start,uint32_t *offset,
                     uint32_t *previous_offset,int *nb_name_parts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  bool bVar9;
  uint32_t previous_recursive;
  int nb_parts_recursive;
  uint32_t local_38 [2];
  
  iVar2 = 0;
  uVar6 = start;
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar8 = uVar5;
    uVar5 = uVar6;
    bVar9 = length <= uVar5;
    if (bVar9) {
LAB_00162c94:
      iVar3 = -iVar2;
LAB_00162c97:
      if (nb_name_parts != (int *)0x0) {
        *nb_name_parts = iVar3;
      }
      if (previous_offset != (uint32_t *)0x0) {
        *previous_offset = uVar4;
      }
      return bVar9;
    }
    bVar1 = packet[uVar5];
    uVar7 = (uint)bVar1;
    if (bVar1 == 0) {
      if (iVar2 == 0) {
        *offset = uVar5;
        iVar3 = 0;
        bVar9 = true;
        goto LAB_00162c97;
      }
      *offset = uVar8;
      bVar9 = true;
      goto LAB_00162c94;
    }
    if ((~uVar7 & 0xc0) == 0) {
      iVar3 = -iVar2;
      if ((length < uVar5 + 2) ||
         (uVar7 = (uint)packet[(ulong)uVar5 + 1] | (uVar7 & 0x3f) << 8, start <= uVar7)) {
        bVar9 = false;
      }
      else {
        local_38[0] = 0;
        local_38[1] = 0;
        bVar9 = GetTLD(packet,length,uVar7,offset,local_38,(int *)(local_38 + 1));
        uVar4 = uVar8;
        if (local_38[0] != 0) {
          uVar4 = local_38[0];
        }
        iVar3 = local_38[1] - iVar2;
      }
      goto LAB_00162c97;
    }
    if ((0x3f < bVar1) || (uVar6 = uVar5 + uVar7 + 1, length < uVar6)) goto LAB_00162c94;
    iVar2 = iVar2 + -1;
    uVar4 = uVar8;
  } while( true );
}

Assistant:

bool DnsStats::GetTLD(uint8_t * packet, uint32_t length, uint32_t start, uint32_t * offset,
    uint32_t * previous_offset,  int * nb_name_parts)
{
    bool ret = true;
    uint32_t l = 0;
    uint32_t previous_o = 0;
    uint32_t previous = 0;
    uint32_t name_start = start;
    int nb_parts = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/

            if (nb_parts != 0)
            {
                *offset = previous;
            }
            else
            {
                *offset = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if ((start + 2) > length)
            {
                ret = false;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];
                
                if (new_start < name_start)
                {
                    int nb_parts_recursive = 0;
                    uint32_t previous_recursive = 0;

                    ret = GetTLD(packet, length, new_start, offset, &previous_recursive, &nb_parts_recursive);
                    if (previous_recursive != 0) {
                        previous_o = previous_recursive;
                    }
                    else {
                        previous_o = previous;
                    }
                    nb_parts += nb_parts_recursive;
                }
                else
                {
                    ret = false;
                }
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* Unexpected name part */
            ret = false;
            break;
        }
        else
        {
            if (start + l + 1 > length)
            {
                /* malformed name part */
                ret = false;
                break;
            }
            else
            {
                nb_parts++;
                previous_o = previous;
                previous = start;
                start += l + 1;
            }
        }
    }

    if (nb_name_parts != NULL) {
        *nb_name_parts = nb_parts;
    }

    if (previous_offset != NULL) {
        *previous_offset = previous_o;
    }

    return ret;
}